

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_load_file(uchar **out,size_t *outsize,char *filename)

{
  uint uVar1;
  size_t __size;
  uchar *out_00;
  
  __size = lodepng_filesize(filename);
  if ((long)__size < 0) {
    uVar1 = 0x4e;
  }
  else {
    *outsize = __size;
    out_00 = (uchar *)malloc(__size);
    *out = out_00;
    uVar1 = 0x53;
    if (__size == 0 || out_00 != (uchar *)0x0) {
      uVar1 = lodepng_buffer_file(out_00,__size,filename);
      return uVar1;
    }
  }
  return uVar1;
}

Assistant:

unsigned lodepng_load_file(unsigned char** out, size_t* outsize, const char* filename)
{
  long size = lodepng_filesize(filename);
  if (size < 0) return 78;
  *outsize = (size_t)size;

  *out = (unsigned char*)lodepng_malloc((size_t)size);
  if(!(*out) && size > 0) return 83; /*the above malloc failed*/

  return lodepng_buffer_file(*out, (size_t)size, filename);
}